

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_config.cc
# Opt level: O0

void MessageCallback(int is_write,int version,int content_type,void *buf,size_t len,SSL *ssl,
                    void *arg)

{
  int iVar1;
  TestConfig *pTVar2;
  size_t sVar3;
  char *pcVar4;
  char local_88 [8];
  char text [16];
  char text_1 [16];
  uint local_60;
  byte local_59;
  uint32_t msg_len;
  uint8_t type;
  CBS cbs;
  TestState *state;
  TestConfig *config;
  uint8_t *buf_u8;
  SSL *ssl_local;
  size_t len_local;
  void *buf_local;
  int content_type_local;
  int version_local;
  int is_write_local;
  
  pTVar2 = GetTestConfig(ssl);
  cbs.len = (size_t)GetTestState(ssl);
  if ((((TestState *)cbs.len)->msg_callback_ok & 1U) != 0) {
    if (content_type == 0x100) {
      if ((pTVar2->is_dtls & 1U) == 0) {
        if (len != 5) {
          fprintf(_stderr,"Incorrect length for record header: %zu.\n",len);
          *(undefined1 *)(cbs.len + 0x98) = 0;
        }
      }
      else if (0xd < len) {
        fprintf(_stderr,"DTLS record header is too long: %zu.\n",len);
      }
    }
    else {
      pcVar4 = "read ";
      if (is_write != 0) {
        pcVar4 = "write ";
      }
      std::__cxx11::string::operator+=((string *)&((TestState *)cbs.len)->msg_callback_text,pcVar4);
      if (content_type == 0) {
        if (version == 2) {
          std::__cxx11::string::operator+=((string *)(cbs.len + 0x78),"v2clienthello\n");
        }
        else {
          fprintf(_stderr,"Incorrect version for V2ClientHello: %x.\n",(ulong)(uint)version);
          *(undefined1 *)(cbs.len + 0x98) = 0;
        }
      }
      else if (content_type == 0x14) {
        if ((len == 1) && (*buf == '\x01')) {
          std::__cxx11::string::operator+=((string *)(cbs.len + 0x78),"ccs\n");
        }
        else {
          fprintf(_stderr,"Invalid ChangeCipherSpec.\n");
          *(undefined1 *)(cbs.len + 0x98) = 0;
        }
      }
      else if (content_type == 0x15) {
        if (len == 2) {
          snprintf(local_88,0x10,"alert %d %d\n",(ulong)*buf,(ulong)*(byte *)((long)buf + 1));
          std::__cxx11::string::operator+=((string *)(cbs.len + 0x78),local_88);
        }
        else {
          fprintf(_stderr,"Invalid alert.\n");
          *(undefined1 *)(cbs.len + 0x98) = 0;
        }
      }
      else {
        if (content_type != 0x16) {
          if (content_type == 0x1a) {
            std::__cxx11::string::operator+=((string *)(cbs.len + 0x78),"ack\n");
            return;
          }
          if (content_type != 0x101) {
            fprintf(_stderr,"Invalid content_type: %d.\n",(ulong)(uint)content_type);
            *(undefined1 *)(cbs.len + 0x98) = 0;
            return;
          }
        }
        CBS_init((CBS *)&msg_len,(uint8_t *)buf,len);
        iVar1 = CBS_get_u8((CBS *)&msg_len,&local_59);
        if (((iVar1 == 0) ||
            ((((pTVar2->is_dtls & 1U) != 0 && (iVar1 = CBS_skip((CBS *)&msg_len,8), iVar1 == 0)) ||
             (iVar1 = CBS_get_u24((CBS *)&msg_len,&local_60), iVar1 == 0)))) ||
           ((iVar1 = CBS_skip((CBS *)&msg_len,(ulong)local_60), iVar1 == 0 ||
            (sVar3 = CBS_len((CBS *)&msg_len), sVar3 != 0)))) {
          fprintf(_stderr,"Could not parse handshake message.\n");
          *(undefined1 *)(cbs.len + 0x98) = 0;
        }
        else if (content_type == 0x101) {
          if (local_59 == 1) {
            std::__cxx11::string::operator+=((string *)(cbs.len + 0x78),"clienthelloinner\n");
          }
          else {
            fprintf(_stderr,"Invalid header for ClientHelloInner.\n");
            *(undefined1 *)(cbs.len + 0x98) = 0;
          }
        }
        else {
          snprintf(text + 8,0x10,"hs %d\n",(ulong)local_59);
          std::__cxx11::string::operator+=((string *)(cbs.len + 0x78),text + 8);
          if (is_write == 0) {
            *(uint *)(cbs.len + 0xc0) = (uint)local_59;
          }
        }
      }
    }
  }
  return;
}

Assistant:

static void MessageCallback(int is_write, int version, int content_type,
                            const void *buf, size_t len, SSL *ssl, void *arg) {
  const uint8_t *buf_u8 = reinterpret_cast<const uint8_t *>(buf);
  const TestConfig *config = GetTestConfig(ssl);
  TestState *state = GetTestState(ssl);
  if (!state->msg_callback_ok) {
    return;
  }

  if (content_type == SSL3_RT_HEADER) {
    if (config->is_dtls) {
      // Starting DTLS 1.3, record headers are variable-length, but they will
      // not be longer than DTLS 1.2's 13-byte header.
      if (len > 13) {
        fprintf(stderr, "DTLS record header is too long: %zu.\n", len);
      }
      return;
    }
    if (len != SSL3_RT_HEADER_LENGTH) {
      fprintf(stderr, "Incorrect length for record header: %zu.\n", len);
      state->msg_callback_ok = false;
    }
    return;
  }

  state->msg_callback_text += is_write ? "write " : "read ";
  switch (content_type) {
    case 0:
      if (version != SSL2_VERSION) {
        fprintf(stderr, "Incorrect version for V2ClientHello: %x.\n",
                static_cast<unsigned>(version));
        state->msg_callback_ok = false;
        return;
      }
      state->msg_callback_text += "v2clienthello\n";
      return;

    case SSL3_RT_CLIENT_HELLO_INNER:
    case SSL3_RT_HANDSHAKE: {
      CBS cbs;
      CBS_init(&cbs, buf_u8, len);
      uint8_t type;
      uint32_t msg_len;
      if (!CBS_get_u8(&cbs, &type) ||
          // TODO(davidben): Reporting on entire messages would be more
          // consistent than fragments.
          (config->is_dtls &&
           !CBS_skip(&cbs, 3 /* total */ + 2 /* seq */ + 3 /* frag_off */)) ||
          !CBS_get_u24(&cbs, &msg_len) || !CBS_skip(&cbs, msg_len) ||
          CBS_len(&cbs) != 0) {
        fprintf(stderr, "Could not parse handshake message.\n");
        state->msg_callback_ok = false;
        return;
      }
      char text[16];
      if (content_type == SSL3_RT_CLIENT_HELLO_INNER) {
        if (type != SSL3_MT_CLIENT_HELLO) {
          fprintf(stderr, "Invalid header for ClientHelloInner.\n");
          state->msg_callback_ok = false;
          return;
        }
        state->msg_callback_text += "clienthelloinner\n";
      } else {
        snprintf(text, sizeof(text), "hs %d\n", type);
        state->msg_callback_text += text;
        if (!is_write) {
          state->last_message_received = type;
        }
      }
      return;
    }

    case SSL3_RT_CHANGE_CIPHER_SPEC:
      if (len != 1 || buf_u8[0] != 1) {
        fprintf(stderr, "Invalid ChangeCipherSpec.\n");
        state->msg_callback_ok = false;
        return;
      }
      state->msg_callback_text += "ccs\n";
      return;

    case SSL3_RT_ALERT:
      if (len != 2) {
        fprintf(stderr, "Invalid alert.\n");
        state->msg_callback_ok = false;
        return;
      }
      char text[16];
      snprintf(text, sizeof(text), "alert %d %d\n", buf_u8[0], buf_u8[1]);
      state->msg_callback_text += text;
      return;

    case SSL3_RT_ACK:
      state->msg_callback_text += "ack\n";
      return;

    default:
      fprintf(stderr, "Invalid content_type: %d.\n", content_type);
      state->msg_callback_ok = false;
  }
}